

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

WalletContext * wallet::EnsureWalletContext(any *context)

{
  long lVar1;
  WalletContext *pWVar2;
  undefined8 uVar3;
  string *in_RDI;
  long in_FS_OFFSET;
  WalletContext *wallet_context;
  any *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = util::AnyPtr<wallet::WalletContext>(in_stack_ffffffffffffff98);
  if (pWVar2 == (WalletContext *)0x0) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0,(allocator<char> *)in_RDI);
    JSONRPCError(in_stack_ffffffffffffffdc,in_RDI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pWVar2;
  }
  __stack_chk_fail();
}

Assistant:

WalletContext& EnsureWalletContext(const std::any& context)
{
    auto wallet_context = util::AnyPtr<WalletContext>(context);
    if (!wallet_context) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Wallet context not found");
    }
    return *wallet_context;
}